

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# atomic_guarded.hpp
# Opt level: O2

function<void_(helics::Endpoint_&,_TimeRepresentation<count_time<9,_long>_>)> * __thiscall
gmlc::libguarded::
atomic_guarded<std::function<void_(helics::Endpoint_&,_TimeRepresentation<count_time<9,_long>_>)>,_std::mutex>
::load(function<void_(helics::Endpoint_&,_TimeRepresentation<count_time<9,_long>_>)>
       *__return_storage_ptr__,
      atomic_guarded<std::function<void_(helics::Endpoint_&,_TimeRepresentation<count_time<9,_long>_>)>,_std::mutex>
      *this)

{
  CLI::std::mutex::lock((mutex *)&this->m_mutex);
  std::function<void_(helics::Endpoint_&,_TimeRepresentation<count_time<9,_long>_>)>::function
            (__return_storage_ptr__,&this->m_obj);
  pthread_mutex_unlock((pthread_mutex_t *)&this->m_mutex);
  return __return_storage_ptr__;
}

Assistant:

T load() const
    {
        std::lock_guard<M> glock(m_mutex);
        return m_obj;
    }